

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammarResolver.cpp
# Opt level: O3

Grammar * __thiscall
xercesc_4_0::GrammarResolver::orphanGrammar(GrammarResolver *this,XMLCh *nameSpaceKey)

{
  RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *pRVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  XMLCh *pXVar5;
  XMLCh XVar6;
  RefHashTableBucketElem<xercesc_4_0::Grammar> *pRVar7;
  Grammar *pGVar8;
  
  if (this->fCacheGrammar == true) {
    iVar3 = (*this->fGrammarPool->_vptr_XMLGrammarPool[4])(this->fGrammarPool,nameSpaceKey);
    pGVar8 = (Grammar *)CONCAT44(extraout_var,iVar3);
    if (pGVar8 == (Grammar *)0x0) {
      pRVar1 = this->fGrammarBucket;
      if ((nameSpaceKey == (XMLCh *)0x0) || (uVar4 = (ulong)(ushort)*nameSpaceKey, uVar4 == 0)) {
        uVar4 = 0;
      }
      else {
        XVar6 = nameSpaceKey[1];
        if (XVar6 != L'\0') {
          pXVar5 = nameSpaceKey + 2;
          do {
            uVar4 = (ulong)(ushort)XVar6 + (uVar4 >> 0x18) + uVar4 * 0x26;
            XVar6 = *pXVar5;
            pXVar5 = pXVar5 + 1;
          } while (XVar6 != L'\0');
        }
        uVar4 = uVar4 % pRVar1->fHashModulus;
      }
      pRVar7 = pRVar1->fBucketList[uVar4];
      if (pRVar7 == (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0) {
        pGVar8 = (Grammar *)0x0;
      }
      else {
        pGVar8 = (Grammar *)0x0;
        do {
          bVar2 = StringHasher::equals
                            ((StringHasher *)&pRVar1->field_0x30,nameSpaceKey,pRVar7->fKey);
          if (bVar2) goto LAB_002eb41a;
          pRVar7 = pRVar7->fNext;
        } while (pRVar7 != (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0);
      }
    }
    else {
      pRVar1 = this->fGrammarFromPool;
      if ((nameSpaceKey == (XMLCh *)0x0) || (uVar4 = (ulong)(ushort)*nameSpaceKey, uVar4 == 0)) {
        uVar4 = 0;
      }
      else {
        XVar6 = nameSpaceKey[1];
        if (XVar6 != L'\0') {
          pXVar5 = nameSpaceKey + 2;
          do {
            uVar4 = (ulong)(ushort)XVar6 + (uVar4 >> 0x18) + uVar4 * 0x26;
            XVar6 = *pXVar5;
            pXVar5 = pXVar5 + 1;
          } while (XVar6 != L'\0');
        }
        uVar4 = uVar4 % pRVar1->fHashModulus;
      }
      pRVar7 = pRVar1->fBucketList[uVar4];
      if (pRVar7 != (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0) {
        do {
          bVar2 = StringHasher::equals
                            ((StringHasher *)&pRVar1->field_0x30,nameSpaceKey,pRVar7->fKey);
          if (bVar2) {
            RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::removeKey
                      (this->fGrammarFromPool,nameSpaceKey);
            return pGVar8;
          }
          pRVar7 = pRVar7->fNext;
        } while (pRVar7 != (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0);
      }
    }
    return pGVar8;
  }
LAB_002eb41a:
  pGVar8 = RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::orphanKey
                     (this->fGrammarBucket,nameSpaceKey);
  return pGVar8;
}

Assistant:

Grammar* GrammarResolver::orphanGrammar(const XMLCh* const nameSpaceKey)
{
    if (fCacheGrammar)
    {
        Grammar* grammar = fGrammarPool->orphanGrammar(nameSpaceKey);
        if (grammar)
        {
            if (fGrammarFromPool->containsKey(nameSpaceKey))
                fGrammarFromPool->removeKey(nameSpaceKey);
        }
        // Check to see if it's in fGrammarBucket, since
        // we put it there if the grammar pool refused to
        // cache it.
        else if (fGrammarBucket->containsKey(nameSpaceKey))
        {
            grammar = fGrammarBucket->orphanKey(nameSpaceKey);
        }

        return grammar;
    }
    else
    {
        return fGrammarBucket->orphanKey(nameSpaceKey);
    }
}